

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameDoesNotExist::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  FlagSaver fs;
  size_type __dnew;
  FlagSaver local_40;
  size_type local_38;
  string local_30;
  
  FlagSaver::FlagSaver(&local_40);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameDoesNotExist");
  paVar1 = &local_30.field_2;
  local_38 = 0x13;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  local_30._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_30,(ulong)&local_38);
  local_30.field_2._M_allocated_capacity = local_38;
  builtin_strncpy(local_30._M_dataplus._M_p,"will not be changed",0x13);
  local_30._M_string_length = local_38;
  local_30._M_dataplus._M_p[local_38] = '\0';
  bVar2 = GetCommandLineOption("test_int3210",&local_30);
  if (bVar2) {
    _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameDoesNotExist::Run();
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_30);
    if (iVar3 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      FlagSaver::~FlagSaver(&local_40);
      return;
    }
  }
  _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameDoesNotExist::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineOptionTest, NameDoesNotExist) {
  string value("will not be changed");
  const bool r = GetCommandLineOption("test_int3210", &value);
  EXPECT_FALSE(r);
  EXPECT_EQ("will not be changed", value);
}